

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosmic_protector.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Player *this;
  void *pvVar3;
  void *pvVar4;
  uint in_EDI;
  EVP_PKEY_CTX *ctx;
  int o;
  ALLEGRO_DISPLAY *display;
  int result;
  ALLEGRO_AUDIO_STREAM *game_music;
  ALLEGRO_AUDIO_STREAM *title_music;
  Player *player;
  ResourceManager *rm;
  int in_stack_00000184;
  int in_stack_ffffffffffffffbc;
  ResourceManager *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int local_4;
  
  ctx = (EVP_PKEY_CTX *)(ulong)in_EDI;
  iVar1 = check_arg(in_stack_ffffffffffffffd0,
                    (char **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (char *)in_stack_ffffffffffffffc0);
  if (iVar1 != 0) {
    useFullScreenMode = true;
  }
  uVar2 = init(ctx);
  if ((uVar2 & 1) == 0) {
    debug_message("Error in initialization.\n");
    local_4 = 1;
  }
  else {
    ResourceManager::getInstance();
    this = (Player *)ResourceManager::getData(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    pvVar3 = ResourceManager::getData(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    pvVar4 = ResourceManager::getData(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    while( true ) {
      if (pvVar3 != (void *)0x0) {
        al_set_audio_stream_playing(pvVar3,1);
      }
      joypad_find();
      while( true ) {
        iVar1 = do_menu();
        al_rest(0x3fd0000000000000);
        if (iVar1 != 1) break;
        do_highscores(in_stack_00000184);
      }
      if ((iVar1 == 2) || (iVar1 == -1)) break;
      if (pvVar3 != (void *)0x0) {
        al_drain_audio_stream(pvVar3);
        al_rewind_audio_stream(pvVar3);
      }
      joypad_stop_finding();
      in_stack_ffffffffffffffc0 =
           (ResourceManager *)
           ResourceManager::getData(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      in_stack_ffffffffffffffbc = al_get_display_orientation(in_stack_ffffffffffffffc0);
      al_set_display_option(in_stack_ffffffffffffffc0,0x20,in_stack_ffffffffffffffbc);
      if (pvVar4 != (void *)0x0) {
        al_set_audio_stream_playing(pvVar4,1);
      }
      (*(this->super_Entity)._vptr_Entity[8])();
      game_loop();
      Player::getScore(this);
      do_highscores(in_stack_00000184);
      (*(this->super_Entity)._vptr_Entity[7])();
      if (pvVar4 != (void *)0x0) {
        al_drain_audio_stream(pvVar4);
        al_rewind_audio_stream(pvVar4);
      }
      al_set_display_option(in_stack_ffffffffffffffc0,0x20,10);
    }
    done();
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
   if (check_arg(argc, argv, "-fullscreen"))
      useFullScreenMode = true;
   if (!init()) {
      debug_message("Error in initialization.\n");
      return 1;
   }

   ResourceManager& rm = ResourceManager::getInstance();
   Player *player = (Player *)rm.getData(RES_PLAYER);

   ALLEGRO_AUDIO_STREAM *title_music = (ALLEGRO_AUDIO_STREAM *)rm.getData(RES_TITLE_MUSIC);
   ALLEGRO_AUDIO_STREAM *game_music = (ALLEGRO_AUDIO_STREAM *)rm.getData(RES_GAME_MUSIC);

   for (;;) {
      if (title_music) {
         al_set_audio_stream_playing(title_music, true);
      }

      joypad_find();

      while (true) {
         int result = do_menu();
         al_rest(0.250);
         if (result == 1) {
            do_highscores(INT_MIN);
	    continue;
         }
         else if (result == 2 || result == -1) {
            done();
	    return 0;
         }
         break;
      }

      if (title_music) {
         al_drain_audio_stream(title_music);
         al_rewind_audio_stream(title_music);
      }

      joypad_stop_finding();

      ALLEGRO_DISPLAY *display = (ALLEGRO_DISPLAY *)rm.getData(RES_DISPLAY);
      int o = al_get_display_orientation(display);
      al_set_display_option(display, ALLEGRO_SUPPORTED_ORIENTATIONS, o);

      if (game_music) {
         al_set_audio_stream_playing(game_music, true);
      }

      player->load();
      game_loop();
      do_highscores(player->getScore());
      player->destroy();

      if (game_music) {
         al_drain_audio_stream(game_music);
         al_rewind_audio_stream(game_music);
      }

      al_set_display_option(display, ALLEGRO_SUPPORTED_ORIENTATIONS, ALLEGRO_DISPLAY_ORIENTATION_LANDSCAPE);

   }

   return 0;
}